

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

QDataStream * __thiscall QDataStream::operator>>(QDataStream *this,qint8 *i)

{
  long lVar1;
  qint64 qVar2;
  undefined1 *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  char c;
  QDataStream *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RSI = 0;
  if ((in_RDI->dev != (QIODevice *)0x0) &&
     (qVar2 = readBlock(in_stack_ffffffffffffffe8,(char *)in_RDI,(qint64)in_RSI), qVar2 == 1)) {
    *in_RSI = 0xaa;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &QDataStream::operator>>(qint8 &i)
{
    i = 0;
    CHECK_STREAM_PRECOND(*this)
    char c;
    if (readBlock(&c, 1) == 1)
        i = qint8(c);
    return *this;
}